

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O3

void __thiscall HdlcAnalyzer::SetupAnalyzer(HdlcAnalyzer *this)

{
  uint uVar1;
  pointer pFVar2;
  pointer pFVar3;
  pointer puVar4;
  uint uVar5;
  BitState BVar6;
  AnalyzerChannelData *pAVar7;
  ulong uVar8;
  pointer this_00;
  double dVar9;
  
  pAVar7 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mHdlc = pAVar7;
  uVar1 = ((this->mSettings)._M_ptr)->mBitRate;
  uVar5 = Analyzer::GetSampleRate();
  dVar9 = ((double)uVar5 * (1.0 / (double)uVar1) * 1000000.0) / 1000000.0;
  uVar8 = (ulong)dVar9;
  this->mSampleRateHz = uVar5;
  uVar8 = (long)(dVar9 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
  this->mSamplesInHalfPeriod = uVar8;
  this->mSamplesInAFlag = uVar8 * 7;
  this->mSamplesIn8Bits = (int)uVar8 << 3;
  BVar6 = AnalyzerChannelData::GetBitState();
  this->mPreviousBitState = BVar6;
  this->mConsecutiveOnes = 0;
  this->mReadingFrame = false;
  this->mAbortFrame = false;
  this->mCurrentFrameIsSFrame = false;
  this->mFoundEndFlag = false;
  pFVar2 = (this->mResultFrames).super__Vector_base<Frame,_std::allocator<Frame>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar3 = (this->mResultFrames).super__Vector_base<Frame,_std::allocator<Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pFVar2;
  if (pFVar3 != pFVar2) {
    do {
      Frame::~Frame(this_00);
      this_00 = this_00 + 0x28;
    } while (this_00 != pFVar3);
    (this->mResultFrames).super__Vector_base<Frame,_std::allocator<Frame>_>._M_impl.
    super__Vector_impl_data._M_finish = pFVar2;
  }
  puVar4 = (this->mCurrentFrameBytes).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar4) {
    (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar4;
  }
  return;
}

Assistant:

void HdlcAnalyzer::SetupAnalyzer()
{
    mHdlc = GetAnalyzerChannelData( mSettings->mInputChannel );

    double halfPeriod = ( 1.0 / double( mSettings->mBitRate ) ) * 1000000.0;
    mSampleRateHz = GetSampleRate();
    mSamplesInHalfPeriod = U64( ( mSampleRateHz * halfPeriod ) / 1000000.0 );
    mSamplesInAFlag = mSamplesInHalfPeriod * 7;
    mSamplesIn8Bits = mSamplesInHalfPeriod * 8;

    mPreviousBitState = mHdlc->GetBitState();
    mConsecutiveOnes = 0;
    mReadingFrame = false;
    mAbortFrame = false;
    mCurrentFrameIsSFrame = false;
    mFoundEndFlag = false;

    mResultFrames.clear();
    mCurrentFrameBytes.clear();
}